

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_format.cc
# Opt level: O1

char * absl::lts_20240722::time_internal::cctz::detail::anon_unknown_0::ParseSubSeconds
                 (char *dp,femtoseconds *subseconds)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  int_fast64_t exp;
  long lVar5;
  long lVar6;
  
  if (dp != (char *)0x0) {
    lVar6 = 0;
    lVar5 = 0;
    pcVar4 = dp;
    do {
      pvVar3 = memchr((anonymous_namespace)::kDigits,(int)*pcVar4,0xb);
      if ((pvVar3 == (void *)0x0) || (iVar2 = (int)pvVar3 + -0x1132d4, 9 < iVar2)) {
        bVar1 = false;
      }
      else {
        if (lVar5 < 0xf) {
          lVar5 = lVar5 + 1;
          lVar6 = (long)iVar2 + lVar6 * 10;
        }
        pcVar4 = pcVar4 + 1;
        bVar1 = true;
      }
    } while (bVar1);
    if (pcVar4 != dp) {
      subseconds->__r = lVar6 * *(long *)((anonymous_namespace)::kExp10 + (0xf - lVar5) * 8);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParseSubSeconds(const char* dp, detail::femtoseconds* subseconds) {
  if (dp != nullptr) {
    std::int_fast64_t v = 0;
    std::int_fast64_t exp = 0;
    const char* const bp = dp;
    while (const char* cp = strchr(kDigits, *dp)) {
      int d = static_cast<int>(cp - kDigits);
      if (d >= 10) break;
      if (exp < 15) {
        exp += 1;
        v *= 10;
        v += d;
      }
      ++dp;
    }
    if (dp != bp) {
      v *= kExp10[15 - exp];
      *subseconds = detail::femtoseconds(v);
    } else {
      dp = nullptr;
    }
  }
  return dp;
}